

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O1

size_t __thiscall Lodtalk::MethodAssembler::Assembler::computeInstructionsSize(Assembler *this)

{
  pointer ppIVar1;
  InstructionNode *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  InstructionNode **instr_2;
  pointer ppIVar5;
  InstructionNode **instr;
  size_t sVar6;
  bool bVar7;
  
  ppIVar1 = (this->instructionStream).
            super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  sVar6 = 0;
  for (ppIVar5 = (this->instructionStream).
                 super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppIVar5 != ppIVar1;
      ppIVar5 = ppIVar5 + 1) {
    pIVar2 = *ppIVar5;
    pIVar2->position = sVar6;
    iVar3 = (*pIVar2->_vptr_InstructionNode[4])(pIVar2);
    pIVar2->size = CONCAT44(extraout_var,iVar3);
    sVar6 = sVar6 + CONCAT44(extraout_var,iVar3);
    pIVar2 = *ppIVar5;
    pIVar2->lastPosition = pIVar2->position;
    pIVar2->lastSize = pIVar2->size;
  }
  do {
    ppIVar5 = (this->instructionStream).
              super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppIVar1 = (this->instructionStream).
              super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar5 == ppIVar1) {
      sVar4 = 0;
    }
    else {
      sVar4 = 0;
      do {
        pIVar2 = *ppIVar5;
        pIVar2->position = sVar4;
        iVar3 = (*pIVar2->_vptr_InstructionNode[5])(pIVar2);
        pIVar2->size = CONCAT44(extraout_var_00,iVar3);
        sVar4 = CONCAT44(extraout_var_00,iVar3) + sVar4;
        ppIVar5 = ppIVar5 + 1;
      } while (ppIVar5 != ppIVar1);
    }
    ppIVar1 = (this->instructionStream).
              super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar5 = (this->instructionStream).
                   super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppIVar5 != ppIVar1;
        ppIVar5 = ppIVar5 + 1) {
      pIVar2 = *ppIVar5;
      pIVar2->lastPosition = pIVar2->position;
      pIVar2->lastSize = pIVar2->size;
    }
    bVar7 = sVar4 < sVar6;
    sVar6 = sVar4;
  } while (bVar7);
  return sVar4;
}

Assistant:

size_t Assembler::computeInstructionsSize()
{
	// Compute the max size.
	size_t maxSize = 0;
	for(auto &instr : instructionStream)
    {
		maxSize += instr->computeMaxSizeForPosition(maxSize);
        instr->commitSize();
    }

	// Compute the optimal iteratively.
	size_t oldSize = maxSize;
	size_t currentSize = maxSize;
	do
	{
		oldSize = currentSize;
		currentSize = 0;
		for(auto &instr : instructionStream)
			currentSize += instr->computeBetterSizeForPosition(currentSize);
        for(auto &instr : instructionStream)
            instr->commitSize();
	} while(currentSize < oldSize);

	return currentSize;
}